

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void __thiscall
amrex::DistributionMapping::KnapSackProcessorMap
          (DistributionMapping *this,BoxArray *boxes,int nprocs)

{
  Long LVar1;
  size_type __n;
  reference pvVar2;
  int in_EDX;
  bool do_full_knapsack;
  Real effi;
  uint N;
  uint i;
  vector<long,_std::allocator<long>_> wgts;
  undefined1 in_stack_00000aef;
  int in_stack_00000af0;
  undefined1 in_stack_00000af7;
  Real *in_stack_00000af8;
  int in_stack_00000b04;
  vector<long,_std::allocator<long>_> *in_stack_00000b08;
  DistributionMapping *in_stack_00000b10;
  int in_stack_ffffffffffffff5c;
  BoxArray *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  vector<long,_std::allocator<long>_> *this_00;
  uint local_48;
  int in_stack_ffffffffffffffc4;
  BoxArray *in_stack_ffffffffffffffc8;
  DistributionMapping *in_stack_ffffffffffffffd0;
  
  std::
  __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0xf53af0);
  BoxArray::size((BoxArray *)0xf53b02);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  LVar1 = BoxArray::size((BoxArray *)0xf53b1c);
  if ((in_EDX < LVar1) && (1 < in_EDX)) {
    __n = BoxArray::size((BoxArray *)0xf53b5e);
    this_00 = (vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffcf;
    std::allocator<long>::allocator((allocator<long> *)0xf53b75);
    std::vector<long,_std::allocator<long>_>::vector
              (this_00,__n,(allocator_type *)in_stack_ffffffffffffff60);
    std::allocator<long>::~allocator((allocator<long> *)0xf53b9b);
    local_48 = 0;
    LVar1 = BoxArray::size((BoxArray *)0xf53bb0);
    for (; local_48 < (uint)LVar1; local_48 = local_48 + 1) {
      BoxArray::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      in_stack_ffffffffffffff60 = (BoxArray *)Box::numPts((Box *)in_stack_ffffffffffffff60);
      pvVar2 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0,
                          (ulong)local_48);
      *pvVar2 = (value_type)in_stack_ffffffffffffff60;
    }
    std::numeric_limits<int>::max();
    KnapSackDoIt(in_stack_00000b10,in_stack_00000b08,in_stack_00000b04,in_stack_00000af8,
                 (bool)in_stack_00000af7,in_stack_00000af0,(bool)in_stack_00000aef);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff60);
  }
  else {
    RoundRobinProcessorMap
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  }
  return;
}

Assistant:

void
DistributionMapping::KnapSackProcessorMap (const BoxArray& boxes,
                                           int             nprocs)
{
    BL_ASSERT(boxes.size() > 0);

    m_ref->m_pmap.resize(boxes.size());

    if (boxes.size() <= nprocs || nprocs < 2)
    {
        RoundRobinProcessorMap(boxes,nprocs);
    }
    else
    {
        std::vector<Long> wgts(boxes.size());

        for (unsigned int i = 0, N = boxes.size(); i < N; ++i)
            wgts[i] = boxes[i].numPts();

        Real effi = 0;
        bool do_full_knapsack = true;
        KnapSackDoIt(wgts, nprocs, effi, do_full_knapsack);
    }
}